

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalUnixMakefileGenerator3.cxx
# Opt level: O2

void __thiscall
cmGlobalUnixMakefileGenerator3::WriteHelpRule
          (cmGlobalUnixMakefileGenerator3 *this,ostream *ruleFileStream,
          cmLocalUnixMakefileGenerator3 *lg)

{
  cmLocalUnixMakefileGenerator3 *pcVar1;
  pointer puVar2;
  pointer pbVar3;
  ostream *poVar4;
  bool bVar5;
  TargetType TVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__v;
  _Base_ptr p_Var7;
  unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_> *localGen;
  pointer puVar8;
  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
  *this_00;
  string *o;
  pointer puVar9;
  pointer pbVar10;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  commands;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  emittedTargets;
  cmAlphaNum local_188;
  cmAlphaNum local_158;
  ostream *local_128;
  pointer local_120;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  utility_targets;
  string path;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  no_depends;
  string local_b0;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  project_targets;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  globals_targets;
  
  path._M_dataplus._M_p = (pointer)&path.field_2;
  path._M_string_length = 0;
  path.field_2._M_local_buf[0] = '\0';
  no_depends.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  no_depends.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  no_depends.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  commands.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  commands.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  commands.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&emittedTargets,
             "The following are some of the valid targets for this Makefile:",
             (allocator<char> *)&utility_targets);
  cmLocalUnixMakefileGenerator3::AppendEcho
            (lg,&commands,(string *)&emittedTargets,EchoNormal,(EchoProgress *)0x0);
  std::__cxx11::string::~string((string *)&emittedTargets);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&emittedTargets,"... all (the default if no target is provided)",
             (allocator<char> *)&utility_targets);
  cmLocalUnixMakefileGenerator3::AppendEcho
            (lg,&commands,(string *)&emittedTargets,EchoNormal,(EchoProgress *)0x0);
  std::__cxx11::string::~string((string *)&emittedTargets);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&emittedTargets,"... clean",(allocator<char> *)&utility_targets);
  cmLocalUnixMakefileGenerator3::AppendEcho
            (lg,&commands,(string *)&emittedTargets,EchoNormal,(EchoProgress *)0x0);
  std::__cxx11::string::~string((string *)&emittedTargets);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&emittedTargets,"CMAKE_SUPPRESS_REGENERATION",
             (allocator<char> *)&utility_targets);
  bVar5 = cmGlobalGenerator::GlobalSettingIsOn((cmGlobalGenerator *)this,(string *)&emittedTargets);
  std::__cxx11::string::~string((string *)&emittedTargets);
  if (!bVar5) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&emittedTargets,"... depend",(allocator<char> *)&utility_targets);
    cmLocalUnixMakefileGenerator3::AppendEcho
              (lg,&commands,(string *)&emittedTargets,EchoNormal,(EchoProgress *)0x0);
    std::__cxx11::string::~string((string *)&emittedTargets);
  }
  emittedTargets._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &emittedTargets._M_t._M_impl.super__Rb_tree_header._M_header;
  emittedTargets._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  emittedTargets._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  emittedTargets._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  utility_targets._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &utility_targets._M_t._M_impl.super__Rb_tree_header._M_header;
  utility_targets._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  utility_targets._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  utility_targets._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  globals_targets._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &globals_targets._M_t._M_impl.super__Rb_tree_header._M_header;
  globals_targets._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  globals_targets._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  globals_targets._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  project_targets._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &project_targets._M_t._M_impl.super__Rb_tree_header._M_header;
  project_targets._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  project_targets._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  project_targets._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  puVar8 = (this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.LocalGenerators.
           super__Vector_base<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>,_std::allocator<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_120 = (this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.LocalGenerators.
              super__Vector_base<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>,_std::allocator<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
  emittedTargets._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       emittedTargets._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  local_128 = ruleFileStream;
  utility_targets._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       utility_targets._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  project_targets._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       project_targets._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  globals_targets._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       globals_targets._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  do {
    if (puVar8 == local_120) {
      for (p_Var7 = globals_targets._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
          (_Rb_tree_header *)p_Var7 != &globals_targets._M_t._M_impl.super__Rb_tree_header;
          p_Var7 = (_Base_ptr)std::_Rb_tree_increment(p_Var7)) {
        local_188.View_._M_len = 4;
        local_188.View_._M_str = "... ";
        local_158.View_._M_str = *(char **)(p_Var7 + 1);
        local_158.View_._M_len = (size_t)p_Var7[1]._M_parent;
        cmStrCat<>(&local_b0,&local_188,&local_158);
        std::__cxx11::string::operator=((string *)&path,(string *)&local_b0);
        std::__cxx11::string::~string((string *)&local_b0);
        cmLocalUnixMakefileGenerator3::AppendEcho(lg,&commands,&path,EchoNormal,(EchoProgress *)0x0)
        ;
      }
      for (p_Var7 = utility_targets._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
          (_Rb_tree_header *)p_Var7 != &utility_targets._M_t._M_impl.super__Rb_tree_header;
          p_Var7 = (_Base_ptr)std::_Rb_tree_increment(p_Var7)) {
        local_188.View_._M_len = 4;
        local_188.View_._M_str = "... ";
        local_158.View_._M_str = *(char **)(p_Var7 + 1);
        local_158.View_._M_len = (size_t)p_Var7[1]._M_parent;
        cmStrCat<>(&local_b0,&local_188,&local_158);
        std::__cxx11::string::operator=((string *)&path,(string *)&local_b0);
        std::__cxx11::string::~string((string *)&local_b0);
        cmLocalUnixMakefileGenerator3::AppendEcho(lg,&commands,&path,EchoNormal,(EchoProgress *)0x0)
        ;
      }
      for (p_Var7 = project_targets._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
          (_Rb_tree_header *)p_Var7 != &project_targets._M_t._M_impl.super__Rb_tree_header;
          p_Var7 = (_Base_ptr)std::_Rb_tree_increment(p_Var7)) {
        local_188.View_._M_len = 4;
        local_188.View_._M_str = "... ";
        local_158.View_._M_str = *(char **)(p_Var7 + 1);
        local_158.View_._M_len = (size_t)p_Var7[1]._M_parent;
        cmStrCat<>(&local_b0,&local_188,&local_158);
        std::__cxx11::string::operator=((string *)&path,(string *)&local_b0);
        std::__cxx11::string::~string((string *)&local_b0);
        cmLocalUnixMakefileGenerator3::AppendEcho(lg,&commands,&path,EchoNormal,(EchoProgress *)0x0)
        ;
      }
      pbVar3 = (lg->LocalHelp).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      for (pbVar10 = (lg->LocalHelp).
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start; pbVar10 != pbVar3;
          pbVar10 = pbVar10 + 1) {
        local_188.View_._M_len = 4;
        local_188.View_._M_str = "... ";
        local_158.View_._M_str = (pbVar10->_M_dataplus)._M_p;
        local_158.View_._M_len = pbVar10->_M_string_length;
        cmStrCat<>(&local_b0,&local_188,&local_158);
        std::__cxx11::string::operator=((string *)&path,(string *)&local_b0);
        std::__cxx11::string::~string((string *)&local_b0);
        cmLocalUnixMakefileGenerator3::AppendEcho(lg,&commands,&path,EchoNormal,(EchoProgress *)0x0)
        ;
      }
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_188,"help",(allocator<char> *)&local_158);
      poVar4 = local_128;
      cmLocalUnixMakefileGenerator3::WriteMakeRule
                (lg,local_128,"Help Target",(string *)&local_188,&no_depends,&commands,true,false);
      std::__cxx11::string::~string((string *)&local_188);
      std::operator<<(poVar4,"\n\n");
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~_Rb_tree(&project_targets._M_t);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~_Rb_tree(&globals_targets._M_t);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~_Rb_tree(&utility_targets._M_t);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~_Rb_tree(&emittedTargets._M_t);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&commands);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&no_depends);
      std::__cxx11::string::~string((string *)&path);
      return;
    }
    pcVar1 = (cmLocalUnixMakefileGenerator3 *)
             (puVar8->_M_t).
             super___uniq_ptr_impl<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>._M_t.
             super__Tuple_impl<0UL,_cmLocalGenerator_*,_std::default_delete<cmLocalGenerator>_>.
             super__Head_base<0UL,_cmLocalGenerator_*,_false>._M_head_impl;
    if ((pcVar1 == lg) || (bVar5 = cmLocalGenerator::IsRootMakefile((cmLocalGenerator *)lg), bVar5))
    {
      puVar2 = *(pointer *)
                &((GeneratorTargetVector *)((long)&pcVar1->super_cmLocalCommonGenerator + 0x150))->
                 super__Vector_base<std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>,_std::allocator<std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>_>_>
      ;
      for (puVar9 = *(pointer *)
                     &((GeneratorTargetVector *)
                      ((long)&pcVar1->super_cmLocalCommonGenerator + 0x148))->
                      super__Vector_base<std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>,_std::allocator<std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>_>_>
          ; puVar9 != puVar2; puVar9 = puVar9 + 1) {
        TVar6 = cmGeneratorTarget::GetType
                          ((puVar9->_M_t).
                           super___uniq_ptr_impl<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_cmGeneratorTarget_*,_std::default_delete<cmGeneratorTarget>_>
                           .super__Head_base<0UL,_cmGeneratorTarget_*,_false>._M_head_impl);
        if (TVar6 < UTILITY) {
LAB_0037c263:
          __v = cmGeneratorTarget::GetName_abi_cxx11_
                          ((puVar9->_M_t).
                           super___uniq_ptr_impl<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_cmGeneratorTarget_*,_std::default_delete<cmGeneratorTarget>_>
                           .super__Head_base<0UL,_cmGeneratorTarget_*,_false>._M_head_impl);
          this_00 = (_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                     *)&project_targets;
LAB_0037c26e:
          std::
          _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
          ::_M_insert_unique<std::__cxx11::string_const&>(this_00,__v);
        }
        else {
          if (TVar6 == UTILITY) {
            __v = cmGeneratorTarget::GetName_abi_cxx11_
                            ((puVar9->_M_t).
                             super___uniq_ptr_impl<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_cmGeneratorTarget_*,_std::default_delete<cmGeneratorTarget>_>
                             .super__Head_base<0UL,_cmGeneratorTarget_*,_false>._M_head_impl);
            this_00 = (_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                       *)&utility_targets;
            goto LAB_0037c26e;
          }
          if (TVar6 == GLOBAL_TARGET) {
            __v = cmGeneratorTarget::GetName_abi_cxx11_
                            ((puVar9->_M_t).
                             super___uniq_ptr_impl<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_cmGeneratorTarget_*,_std::default_delete<cmGeneratorTarget>_>
                             .super__Head_base<0UL,_cmGeneratorTarget_*,_false>._M_head_impl);
            this_00 = (_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                       *)&globals_targets;
            goto LAB_0037c26e;
          }
          if ((TVar6 == INTERFACE_LIBRARY) &&
             (bVar5 = cmGeneratorTarget::IsInBuildSystem
                                ((puVar9->_M_t).
                                 super___uniq_ptr_impl<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_cmGeneratorTarget_*,_std::default_delete<cmGeneratorTarget>_>
                                 .super__Head_base<0UL,_cmGeneratorTarget_*,_false>._M_head_impl),
             bVar5)) goto LAB_0037c263;
        }
      }
    }
    puVar8 = puVar8 + 1;
  } while( true );
}

Assistant:

void cmGlobalUnixMakefileGenerator3::WriteHelpRule(
  std::ostream& ruleFileStream, cmLocalUnixMakefileGenerator3* lg)
{
  // add the help target
  std::string path;
  std::vector<std::string> no_depends;
  std::vector<std::string> commands;
  lg->AppendEcho(commands,
                 "The following are some of the valid targets "
                 "for this Makefile:");
  lg->AppendEcho(commands, "... all (the default if no target is provided)");
  lg->AppendEcho(commands, "... clean");
  if (!this->GlobalSettingIsOn("CMAKE_SUPPRESS_REGENERATION")) {
    lg->AppendEcho(commands, "... depend");
  }

  // Keep track of targets already listed.
  std::set<std::string> emittedTargets;
  std::set<std::string> utility_targets;
  std::set<std::string> globals_targets;
  std::set<std::string> project_targets;

  // for each local generator
  for (const auto& localGen : this->LocalGenerators) {
    const auto& lg2 =
      cm::static_reference_cast<cmLocalUnixMakefileGenerator3>(localGen);
    // for the passed in makefile or if this is the top Makefile wripte out
    // the targets
    if (&lg2 == lg || lg->IsRootMakefile()) {
      // for each target Generate the rule files for each target.
      for (const auto& target : lg2.GetGeneratorTargets()) {
        cmStateEnums::TargetType type = target->GetType();
        if ((type == cmStateEnums::EXECUTABLE) ||
            (type == cmStateEnums::STATIC_LIBRARY) ||
            (type == cmStateEnums::SHARED_LIBRARY) ||
            (type == cmStateEnums::MODULE_LIBRARY) ||
            (type == cmStateEnums::OBJECT_LIBRARY) ||
            (type == cmStateEnums::INTERFACE_LIBRARY &&
             target->IsInBuildSystem())) {
          project_targets.insert(target->GetName());
        } else if (type == cmStateEnums::GLOBAL_TARGET) {
          globals_targets.insert(target->GetName());
        } else if (type == cmStateEnums::UTILITY) {
          utility_targets.insert(target->GetName());
        }
      }
    }
  }

  for (std::string const& name : globals_targets) {
    path = cmStrCat("... ", name);
    lg->AppendEcho(commands, path);
  }
  for (std::string const& name : utility_targets) {
    path = cmStrCat("... ", name);
    lg->AppendEcho(commands, path);
  }
  for (std::string const& name : project_targets) {
    path = cmStrCat("... ", name);
    lg->AppendEcho(commands, path);
  }

  for (std::string const& o : lg->GetLocalHelp()) {
    path = cmStrCat("... ", o);
    lg->AppendEcho(commands, path);
  }
  lg->WriteMakeRule(ruleFileStream, "Help Target", "help", no_depends,
                    commands, true);
  ruleFileStream << "\n\n";
}